

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

bool __thiscall LiteScript::Character::operator==(Character *this,String *str)

{
  bool bVar1;
  char32_t *pcVar2;
  String local_38;
  String *local_18;
  String *str_local;
  Character *this_local;
  
  local_18 = str;
  str_local = (String *)this;
  pcVar2 = String::operator[](this->str,this->i);
  String::String(&local_38,*pcVar2);
  bVar1 = String::operator==(&local_38,local_18);
  String::~String(&local_38);
  return bVar1;
}

Assistant:

bool LiteScript::Character::operator==(const LiteScript::String& str) const {
    return (String(this->str[i]) == str);
}